

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O3

void __thiscall
Diligent::DeviceContextVkImpl::SetViewports
          (DeviceContextVkImpl *this,Uint32 NumViewports,Viewport *pViewports,Uint32 RTWidth,
          Uint32 RTHeight)

{
  RenderingInfoWrapper *__ptr;
  PipelineStateVkImpl *this_00;
  Uint32 UVar1;
  Uint32 UVar2;
  string msg;
  string local_48;
  Uint32 local_28;
  Uint32 local_24;
  
  local_28 = RTHeight;
  local_24 = RTWidth;
  DeviceContextBase<Diligent::EngineVkImplTraits>::SetViewports
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,NumViewports,pViewports,
             &local_24,&local_28);
  if ((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
      super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_NumViewports != NumViewports) {
    FormatString<char[31]>(&local_48,(char (*) [31])"Unexpected number of viewports");
    DebugAssertionFailed
              (local_48._M_dataplus._M_p,"SetViewports",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x6b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->m_State).NullRenderTargets == true) {
    if ((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
        super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_NumViewports != 1) {
      FormatString<char[74]>
                (&local_48,
                 (char (*) [74])
                 "Only a single viewport is supported when rendering without render targets");
      DebugAssertionFailed
                (local_48._M_dataplus._M_p,"SetViewports",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0x6bc);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
    }
    UVar1 = (Uint32)(long)(float)(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>
                                 ).super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_Viewports
                                 [0].Width;
    UVar2 = (Uint32)(long)(float)(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>
                                 ).super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_Viewports
                                 [0].Height;
    if (((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
         super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_FramebufferWidth != UVar1) ||
       ((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
        super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_FramebufferHeight != UVar2)) {
      __ptr = (this->m_DynamicRenderingInfo)._M_t.
              super___uniq_ptr_impl<VulkanUtilities::RenderingInfoWrapper,_std::default_delete<VulkanUtilities::RenderingInfoWrapper>_>
              ._M_t.
              super__Tuple_impl<0UL,_VulkanUtilities::RenderingInfoWrapper_*,_std::default_delete<VulkanUtilities::RenderingInfoWrapper>_>
              .super__Head_base<0UL,_VulkanUtilities::RenderingInfoWrapper_*,_false>._M_head_impl;
      this->m_vkFramebuffer = (VkFramebuffer)0x0;
      (this->m_DynamicRenderingInfo)._M_t.
      super___uniq_ptr_impl<VulkanUtilities::RenderingInfoWrapper,_std::default_delete<VulkanUtilities::RenderingInfoWrapper>_>
      ._M_t.
      super__Tuple_impl<0UL,_VulkanUtilities::RenderingInfoWrapper_*,_std::default_delete<VulkanUtilities::RenderingInfoWrapper>_>
      .super__Head_base<0UL,_VulkanUtilities::RenderingInfoWrapper_*,_false>._M_head_impl =
           (RenderingInfoWrapper *)0x0;
      if (__ptr != (RenderingInfoWrapper *)0x0) {
        std::default_delete<VulkanUtilities::RenderingInfoWrapper>::operator()
                  ((default_delete<VulkanUtilities::RenderingInfoWrapper> *)
                   &this->m_DynamicRenderingInfo,__ptr);
      }
    }
    (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
    super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_FramebufferWidth = UVar1;
    (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
    super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_FramebufferHeight = UVar2;
    (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
    super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_FramebufferSlices = 1;
    (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
    super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_FramebufferSamples = 1;
  }
  this_00 = (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
            super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pPipelineState.m_pObject;
  if (this_00 != (PipelineStateVkImpl *)0x0) {
    PipelineStateBase<Diligent::EngineVkImplTraits>::CheckPipelineReady
              (&this_00->super_PipelineStateBase<Diligent::EngineVkImplTraits>);
    if (((this_00->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
         super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
         .m_Desc.PipelineType & ~PIPELINE_TYPE_MESH) == PIPELINE_TYPE_GRAPHICS) {
      CommitViewports(this);
    }
  }
  return;
}

Assistant:

void DeviceContextVkImpl::SetViewports(Uint32 NumViewports, const Viewport* pViewports, Uint32 RTWidth, Uint32 RTHeight)
{
    TDeviceContextBase::SetViewports(NumViewports, pViewports, RTWidth, RTHeight);
    VERIFY(NumViewports == m_NumViewports, "Unexpected number of viewports");

    if (m_State.NullRenderTargets)
    {
        DEV_CHECK_ERR(m_NumViewports == 1, "Only a single viewport is supported when rendering without render targets");

        const Uint32 VPWidth  = static_cast<Uint32>(m_Viewports[0].Width);
        const Uint32 VPHeight = static_cast<Uint32>(m_Viewports[0].Height);
        if (m_FramebufferWidth != VPWidth || m_FramebufferHeight != VPHeight)
        {
            // We need to bind another framebuffer since the size has changed
            m_vkFramebuffer = VK_NULL_HANDLE;
            m_DynamicRenderingInfo.reset();
        }
        m_FramebufferWidth   = VPWidth;
        m_FramebufferHeight  = VPHeight;
        m_FramebufferSlices  = 1;
        m_FramebufferSamples = 1;
    }

    // If no graphics PSO is currently bound, viewports will be committed by
    // the SetPipelineState() when a graphics PSO is set.
    if (m_pPipelineState && m_pPipelineState->GetDesc().IsAnyGraphicsPipeline())
    {
        CommitViewports();
    }
}